

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

int xm_check_sanity_preload(char *module,size_t module_length)

{
  int iVar1;
  
  if (0x3b < module_length) {
    iVar1 = bcmp("Extended Module: ",module,0x11);
    if (iVar1 == 0) {
      if (module[0x25] == '\x1a') {
        if (module[0x3b] == '\x01') {
          iVar1 = (uint)(module[0x3a] != '\x04') * 3;
        }
        else {
          iVar1 = 3;
        }
      }
      else {
        iVar1 = 2;
      }
    }
    else {
      iVar1 = 1;
    }
    return iVar1;
  }
  return 4;
}

Assistant:

int xm_check_sanity_preload(const char* module, size_t module_length) {
	if(module_length < 60) {
		return 4;
	}

	if(memcmp("Extended Module: ", module, 17) != 0) {
		return 1;
	}

	if(module[37] != 0x1A) {
		return 2;
	}

	if(module[59] != 0x01 || module[58] != 0x04) {
		/* Not XM 1.04 */
		return 3;
	}

	return 0;
}